

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

void __thiscall llvm::yaml::Scanner::scan_ns_uri_char(Scanner *this)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  StringRef local_58;
  StringRef local_48;
  Scanner *local_38;
  Scanner *this_local;
  iterator local_28;
  StringRef *local_20;
  char *local_18;
  StringRef *local_10;
  
  local_38 = this;
  do {
    if (this->Current == this->End) {
      return;
    }
    if (((*this->Current == '%') && (this->Current + 2 < this->End)) &&
       (bVar1 = is_ns_hex_digit(this->Current[1]), bVar1)) {
      bVar2 = is_ns_hex_digit(this->Current[2]);
      bVar1 = true;
      if (!bVar2) goto LAB_003297e1;
    }
    else {
LAB_003297e1:
      bVar2 = is_ns_word_char(*this->Current);
      bVar1 = true;
      if (!bVar2) {
        local_28 = this->Current;
        local_20 = &local_48;
        this_local = (Scanner *)0x1;
        local_48.Length = 1;
        local_10 = &local_58;
        local_18 = "#;/?:@&=+$,_.!~*\'()[]";
        local_48.Data = local_28;
        strlen("#;/?:@&=+$,_.!~*\'()[]");
        sVar3 = StringRef::find_first_of(&local_48,local_58,0);
        bVar1 = sVar3 != 0xffffffffffffffff;
      }
    }
    if (!bVar1) {
      return;
    }
    this->Current = this->Current + 1;
    this->Column = this->Column + 1;
  } while( true );
}

Assistant:

void Scanner::scan_ns_uri_char() {
  while (true) {
    if (Current == End)
      break;
    if ((   *Current == '%'
          && Current + 2 < End
          && is_ns_hex_digit(*(Current + 1))
          && is_ns_hex_digit(*(Current + 2)))
        || is_ns_word_char(*Current)
        || StringRef(Current, 1).find_first_of("#;/?:@&=+$,_.!~*'()[]")
          != StringRef::npos) {
      ++Current;
      ++Column;
    } else
      break;
  }
}